

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O1

void bsp_sync(void)

{
  int iVar1;
  
  if ((s_spmd == (Spmd *)0x0) || (s_spmd->m_closed == true)) {
    bsp_abort("bsp_sync: can only be called within SPMD section\n");
  }
  iVar1 = bsplib::Spmd::normal_sync(s_spmd);
  if (iVar1 != 0) {
    bsp_abort(
             "bsp_sync/bsp_end: Some processes have called bsp_sync, while others have called bsp_end instead\n"
             );
  }
  bsplib::Rdma::sync(s_rdma);
  bsplib::Bsmp::sync(s_bsmp);
  return;
}

Assistant:

void bsp_sync()
{
    if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_sync: can only be called within SPMD section\n");

    if (s_spmd->normal_sync())
        bsp_abort("bsp_sync/bsp_end: Some processes have called bsp_sync, "
               "while others have called bsp_end instead\n");

#ifdef PROFILE
    { TicToc imb( TicToc::IMBALANCE );
      MPI_Barrier( s_spmd->comm() );
    }
#endif

#ifdef PROFILE
    TicToc t( TicToc::SYNC );
#endif
    bool dummy_bsmp = s_bsmp->is_dummy();

    try {
        dummy_bsmp = s_rdma->sync( dummy_bsmp );
    }
    catch( bsplib :: exception & e ) {
        bsp_abort("bsp_sync/%s\n", e.str().c_str() );
    }

    try {
        s_bsmp->sync( dummy_bsmp );
    }
    catch( bsplib  :: exception & e ) {
        bsp_abort("bsp_sync/%s\n", e.str().c_str() );
    }
}